

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void kratos::hash_generators_context(Context *context,Generator *root,HashStrategy strategy)

{
  pointer *this;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  size_type sVar5;
  size_type sVar6;
  undefined4 extraout_var;
  reference ppGVar7;
  uint64_t hash_00;
  reference __x;
  iterator first;
  iterator last;
  value_type *ppGVar8;
  reference ppGVar9;
  reference pvVar10;
  value_type hash_1;
  value_type *node_3;
  uint64_t j;
  undefined1 local_2b8 [8];
  future<unsigned_long> task;
  Generator **node_2;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> thread_tasks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hash_values;
  value_type list_1;
  undefined1 local_238 [4];
  int i;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  levels;
  thread_pool pool;
  uint32_t num_cpus;
  uint64_t hash;
  Generator **node_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__range2_1;
  string local_e8;
  reference local_c8;
  Generator **node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__range2;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> list;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> local_80;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *local_68;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *sequence;
  GeneratorGraph g;
  HashStrategy strategy_local;
  Generator *root_local;
  Context *context_local;
  
  g.root_._4_4_ = strategy;
  bVar1 = Context::track_generated(context);
  if (!bVar1) {
    Context::clear_hash(context);
  }
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)&sequence,root);
  if (g.root_._4_4_ == SequentialHash) {
    GeneratorGraph::get_sorted_nodes(&local_80,(GeneratorGraph *)&sequence);
    local_68 = &local_80;
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)&__range2);
    sVar5 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::size(local_68);
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)&__range2,sVar5)
    ;
    this_00 = local_68;
    __end2 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::begin(local_68)
    ;
    node = (Generator **)
           std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<kratos::Generator_*const_*,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                                       *)&node), bVar1) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<kratos::Generator_*const_*,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                 ::operator*(&__end2);
      bVar1 = Generator::external(*local_c8);
      if (bVar1) {
        Generator::external_filename_abi_cxx11_(&local_e8,*local_c8);
        bVar2 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_e8);
        if ((bVar2 & 1) == 0) {
          hash_generator_src(context,*local_c8);
        }
      }
      else {
        Context::get_generators_by_name
                  ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)&__range2_1,context,&(*local_c8)->name);
        sVar6 = std::
                set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                ::size((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                        *)&__range2_1);
        std::
        set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~set((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&__range2_1);
        if (sVar6 == 1) {
          hash_generator_name(context,*local_c8);
        }
        else {
          iVar3 = (*((*local_c8)->super_IRNode)._vptr_IRNode[4])();
          if ((CONCAT44(extraout_var,iVar3) != 0) || (*local_c8 == root)) {
            std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
            emplace_back<kratos::Generator*const&>
                      ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)&__range2,
                       local_c8);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<kratos::Generator_*const_*,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::begin
                         ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                          &__range2);
    node_1 = (Generator **)
             std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::end
                       ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                        &__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                               *)&node_1), bVar1) {
      ppGVar7 = __gnu_cxx::
                __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                ::operator*(&__end2_1);
      hash_00 = hash_generator(*ppGVar7);
      Context::add_hash(context,*ppGVar7,hash_00);
      __gnu_cxx::
      __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~vector
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)&__range2);
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~vector(&local_80);
  }
  else if (g.root_._4_4_ == ParallelHash) {
    uVar4 = get_num_cpus();
    cxxpool::thread_pool::thread_pool
              ((thread_pool *)
               &levels.
                super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar4);
    GeneratorGraph::get_leveled_nodes
              ((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                *)local_238,(GeneratorGraph *)&sequence);
    sVar5 = std::
            vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
            ::size((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                    *)local_238);
    list_1.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar5;
    while (list_1.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                list_1.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1,
          -1 < list_1.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
      __x = std::
            vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
            ::operator[]((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                          *)local_238,
                         (long)list_1.
                               super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
                ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 &hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &thread_tasks.
                  super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>::vector
                ((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> *
                 )&__range4);
      sVar5 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::size
                        ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                         &hash_values.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>::reserve
                ((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> *
                 )&__range4,sVar5);
      this = &hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      __end4 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::begin
                         ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)this)
      ;
      node_2 = (Generator **)
               std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::end
                         ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)this)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                                         *)&node_2), bVar1) {
        task.super___basic_future<unsigned_long>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
             ::operator*(&__end4);
        cxxpool::thread_pool::push<unsigned_long(&)(kratos::Generator*),kratos::Generator*const&>
                  ((thread_pool *)local_2b8,
                   (_func_unsigned_long_Generator_ptr *)
                   &levels.
                    super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Generator **)hash_generator)
        ;
        std::vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>>::
        emplace_back<std::future<unsigned_long>>
                  ((vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>> *)
                   &__range4,(future<unsigned_long> *)local_2b8);
        std::future<unsigned_long>::~future((future<unsigned_long> *)local_2b8);
        __gnu_cxx::
        __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
        ::operator++(&__end4);
      }
      first = std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
              ::begin((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                       *)&__range4);
      last = std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>::
             end((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> *
                 )&__range4);
      cxxpool::
      get<std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<std::future<unsigned_long>*,std::vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>>>,void>
                ((__normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
                  )first._M_current,
                 (__normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
                  )last._M_current,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &thread_tasks.
                  super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      for (node_3 = (value_type *)0x0;
          ppGVar8 = (value_type *)
                    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::size
                              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                               &hash_values.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage), node_3 < ppGVar8
          ; node_3 = (value_type *)((long)node_3 + 1)) {
        ppGVar9 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::operator[]
                            ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                             &hash_values.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)node_3);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &thread_tasks.
                              super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)node_3);
        Context::add_hash(context,*ppGVar9,*pvVar10);
      }
      std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>::~vector
                ((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> *
                 )&__range4);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &thread_tasks.
                  super__Vector_base<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~vector
                ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 &hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
    ::~vector((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
               *)local_238);
    cxxpool::thread_pool::~thread_pool
              ((thread_pool *)
               &levels.
                super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  GeneratorGraph::~GeneratorGraph((GeneratorGraph *)&sequence);
  return;
}

Assistant:

void hash_generators_context(Context* context, Generator* root, HashStrategy strategy) {
    // clear the hash first
    if (!context->track_generated()) context->clear_hash();

    // compute the generator graph
    GeneratorGraph g(root);
    // if it's sequential, do topological sort
    // if it's parallel, do level sort

    if (strategy == HashStrategy::SequentialHash) {
        auto const& sequence = g.get_sorted_nodes();
        std::vector<Generator*> list;
        // reserve for list
        list.reserve(sequence.size());

        for (auto const& node : sequence) {
            // different cases
            if (node->external()) {
                if (node->external_filename().empty()) {
                    // user marked external file, skip it
                    continue;
                } else {
                    hash_generator_src(context, node);
                }
            } else if (context->get_generators_by_name(node->name).size() == 1) {
                // just need to hash the name
                hash_generator_name(context, node);
            } else {
                // only the one being used
                if (node->parent() == nullptr && node != root) continue;
                list.emplace_back(node);
            }
        }
        for (auto const& node : list) {
            uint64_t hash = hash_generator(node);
            context->add_hash(node, hash);
        }
    } else if (strategy == HashStrategy::ParallelHash) {
        uint32_t num_cpus = get_num_cpus();
        cxxpool::thread_pool pool{num_cpus};

        auto levels = g.get_leveled_nodes();
        // we proceed in a reversed order
        for (int i = static_cast<int>(levels.size() - 1); i >= 0; i--) {
            auto list = levels[i];
            std::vector<uint64_t> hash_values;
            std::vector<std::future<uint64_t>> thread_tasks;
            thread_tasks.reserve(list.size());

            for (auto const& node : list) {
                auto task = pool.push(hash_generator, node);
                thread_tasks.emplace_back(std::move(task));
            }

            cxxpool::get(thread_tasks.begin(), thread_tasks.end(), hash_values);
            for (uint64_t j = 0; j < list.size(); j++) {
                auto const& node = list[j];
                auto const hash = hash_values[j];
                context->add_hash(node, hash);
            }
        }
    }
}